

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracteventdispatcher.cpp
# Opt level: O3

TimerId __thiscall
QAbstractEventDispatcher::registerTimer
          (QAbstractEventDispatcher *this,Duration interval,TimerType timerType,QObject *object)

{
  TimerId TVar1;
  
  TVar1 = QAbstractEventDispatcherPrivate::allocateTimerId();
  if (*(char *)(*(long *)(this + 8) + 0x90) == '\x01') {
    (**(code **)(*(long *)this + 0xc0))(this,TVar1,interval.__r,timerType,object);
  }
  else {
    (**(code **)(*(long *)this + 0x78))
              (this,TVar1,
               interval.__r / 1000000 + (ulong)((interval.__r / 1000000) * 1000000 < interval.__r),
               timerType,object);
  }
  return TVar1;
}

Assistant:

Qt::TimerId QAbstractEventDispatcher::registerTimer(Duration interval, Qt::TimerType timerType,
                                                    QObject *object)
{
    auto id = Qt::TimerId(QAbstractEventDispatcherPrivate::allocateTimerId());
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0)
    if (QAbstractEventDispatcherV2 *self = v2(this))
        self->registerTimer(id, interval, timerType, object);
    else
        registerTimer(qToUnderlying(id), fromDuration<qint64>(interval), timerType, object);
#else
    registerTimer(id, interval, timerType, object);
#endif
    return id;
}